

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void get_intra_q_and_bounds
               (AV1_COMP *cpi,int width,int height,int *active_best,int *active_worst,int cq_level)

{
  AV1_PRIMARY *pAVar1;
  int iVar2;
  int iVar3;
  int *in_RCX;
  AV1_COMP *in_RDI;
  int *in_R8;
  int in_R9D;
  RATE_CONTROL *rc_00;
  double q_val;
  double q_adj_factor;
  int last_boosted_qindex;
  int qindex;
  int delta_qindex;
  double last_boosted_q;
  int bit_depth;
  int active_worst_quality;
  int active_best_quality;
  AV1EncoderConfig *oxcf;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  AV1_COMMON *cm;
  aom_bit_depth_t in_stack_ffffffffffffff68;
  aom_bit_depth_t in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  aom_bit_depth_t in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  PRIMARY_RATE_CONTROL *in_stack_ffffffffffffff80;
  int local_50;
  int local_4c;
  
  pAVar1 = in_RDI->ppi;
  iVar3 = *in_R8;
  if ((1 < (in_RDI->rc).frames_to_key) ||
     (local_50 = in_R9D, local_4c = in_R9D, (in_RDI->oxcf).rc_cfg.mode != AOM_Q)) {
    local_50 = iVar3;
    if ((pAVar1->p_rc).this_key_frame_forced == 0) {
      local_4c = get_kf_active_quality
                           (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
                            in_stack_ffffffffffffff78);
      if (in_RDI->is_screen_content_type != 0) {
        local_4c = local_4c / 2;
      }
      iVar3 = is_stat_consumption_stage_twopass(in_RDI);
      if ((iVar3 != 0) && (0x62 < (in_RDI->ppi->twopass).kf_zeromotion_pct)) {
        local_4c = local_4c / 3;
      }
      is_stat_consumption_stage_twopass(in_RDI);
      rc_00 = (RATE_CONTROL *)
              av1_convert_qindex_to_q(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
      iVar3 = av1_compute_qdelta(rc_00,(double)CONCAT44(in_stack_ffffffffffffff7c,
                                                        in_stack_ffffffffffffff78),
                                 (double)CONCAT44(in_stack_ffffffffffffff74,
                                                  in_stack_ffffffffffffff70),
                                 in_stack_ffffffffffffff6c);
      local_4c = iVar3 + local_4c;
      if (((in_RDI->oxcf).rc_cfg.mode == AOM_Q) &&
         (((in_RDI->superres_mode == AOM_SUPERRES_QTHRESH ||
           (in_RDI->superres_mode == AOM_SUPERRES_AUTO)) &&
          ((in_RDI->common).superres_scale_denominator != '\b')))) {
        if ((int)(local_4c + ((in_RDI->common).superres_scale_denominator - 8) * -2) < 1) {
          local_4c = 0;
        }
        else {
          local_4c = local_4c + ((in_RDI->common).superres_scale_denominator - 8) * -2;
        }
      }
    }
    else {
      local_4c = (pAVar1->p_rc).last_boosted_qindex;
      iVar2 = is_stat_consumption_stage_twopass(in_RDI);
      if ((iVar2 == 0) || ((in_RDI->ppi->twopass).last_kfgroup_zeromotion_pct < 0x5f)) {
        av1_convert_qindex_to_q(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
        iVar3 = av1_compute_qdelta((RATE_CONTROL *)in_stack_ffffffffffffff80,
                                   (double)CONCAT44(in_stack_ffffffffffffff7c,
                                                    in_stack_ffffffffffffff78),
                                   (double)CONCAT44(in_stack_ffffffffffffff74,
                                                    in_stack_ffffffffffffff70),
                                   in_stack_ffffffffffffff6c);
        if ((in_RDI->rc).best_quality < local_4c + iVar3) {
          local_4c = local_4c + iVar3;
        }
        else {
          local_4c = (in_RDI->rc).best_quality;
        }
      }
      else {
        if ((pAVar1->p_rc).last_kf_qindex < local_4c) {
          local_4c = (pAVar1->p_rc).last_kf_qindex;
        }
        iVar2 = local_4c;
        av1_convert_qindex_to_q(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
        iVar2 = av1_compute_qdelta((RATE_CONTROL *)in_stack_ffffffffffffff80,
                                   (double)CONCAT44(iVar2,in_stack_ffffffffffffff78),
                                   (double)CONCAT44(in_stack_ffffffffffffff74,
                                                    in_stack_ffffffffffffff70),
                                   in_stack_ffffffffffffff6c);
        if (local_4c + iVar2 < iVar3) {
          local_50 = local_4c + iVar2;
        }
      }
    }
  }
  *in_RCX = local_4c;
  *in_R8 = local_50;
  return;
}

Assistant:

static void get_intra_q_and_bounds(const AV1_COMP *cpi, int width, int height,
                                   int *active_best, int *active_worst,
                                   int cq_level) {
  const AV1_COMMON *const cm = &cpi->common;
  const RATE_CONTROL *const rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  int active_best_quality;
  int active_worst_quality = *active_worst;
  const int bit_depth = cm->seq_params->bit_depth;

  if (rc->frames_to_key <= 1 && oxcf->rc_cfg.mode == AOM_Q) {
    // If the next frame is also a key frame or the current frame is the
    // only frame in the sequence in AOM_Q mode, just use the cq_level
    // as q.
    active_best_quality = cq_level;
    active_worst_quality = cq_level;
  } else if (p_rc->this_key_frame_forced) {
    // Handle the special case for key frames forced when we have reached
    // the maximum key frame interval. Here force the Q to a range
    // based on the ambient Q to reduce the risk of popping.
    double last_boosted_q;
    int delta_qindex;
    int qindex;
#if CONFIG_FPMT_TEST
    const int simulate_parallel_frame =
        cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0 &&
        cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE;
    int last_boosted_qindex = simulate_parallel_frame
                                  ? p_rc->temp_last_boosted_qindex
                                  : p_rc->last_boosted_qindex;
#else
    int last_boosted_qindex = p_rc->last_boosted_qindex;
#endif
    if (is_stat_consumption_stage_twopass(cpi) &&
        cpi->ppi->twopass.last_kfgroup_zeromotion_pct >= STATIC_MOTION_THRESH) {
      qindex = AOMMIN(p_rc->last_kf_qindex, last_boosted_qindex);
      active_best_quality = qindex;
      last_boosted_q = av1_convert_qindex_to_q(qindex, bit_depth);
      delta_qindex = av1_compute_qdelta(rc, last_boosted_q,
                                        last_boosted_q * 1.25, bit_depth);
      active_worst_quality =
          AOMMIN(qindex + delta_qindex, active_worst_quality);
    } else {
      qindex = last_boosted_qindex;
      last_boosted_q = av1_convert_qindex_to_q(qindex, bit_depth);
      delta_qindex = av1_compute_qdelta(rc, last_boosted_q,
                                        last_boosted_q * 0.50, bit_depth);
      active_best_quality = AOMMAX(qindex + delta_qindex, rc->best_quality);
    }
  } else {
    // Not forced keyframe.
    double q_adj_factor = 1.0;
    double q_val;

    // Baseline value derived from active_worst_quality and kf boost.
    active_best_quality =
        get_kf_active_quality(p_rc, active_worst_quality, bit_depth);
    if (cpi->is_screen_content_type) {
      active_best_quality /= 2;
    }

    if (is_stat_consumption_stage_twopass(cpi) &&
        cpi->ppi->twopass.kf_zeromotion_pct >= STATIC_KF_GROUP_THRESH) {
      active_best_quality /= 3;
    }

    // Allow somewhat lower kf minq with small image formats.
    if ((width * height) <= (352 * 288)) {
      q_adj_factor -= 0.25;
    }

    // Make a further adjustment based on the kf zero motion measure.
    if (is_stat_consumption_stage_twopass(cpi))
      q_adj_factor +=
          0.05 - (0.001 * (double)cpi->ppi->twopass.kf_zeromotion_pct);

    // Convert the adjustment factor to a qindex delta
    // on active_best_quality.
    q_val = av1_convert_qindex_to_q(active_best_quality, bit_depth);
    active_best_quality +=
        av1_compute_qdelta(rc, q_val, q_val * q_adj_factor, bit_depth);

    // Tweak active_best_quality for AOM_Q mode when superres is on, as this
    // will be used directly as 'q' later.
    if (oxcf->rc_cfg.mode == AOM_Q &&
        (cpi->superres_mode == AOM_SUPERRES_QTHRESH ||
         cpi->superres_mode == AOM_SUPERRES_AUTO) &&
        cm->superres_scale_denominator != SCALE_NUMERATOR) {
      active_best_quality =
          AOMMAX(active_best_quality -
                     ((cm->superres_scale_denominator - SCALE_NUMERATOR) *
                      SUPERRES_QADJ_PER_DENOM_KEYFRAME),
                 0);
    }
  }
  *active_best = active_best_quality;
  *active_worst = active_worst_quality;
}